

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_sets.cc
# Opt level: O0

TargetBits highwayhash::InstructionSets::Supported(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint32_t xcr0;
  bool has_osxsave;
  uint uStack_58;
  bool has_xsave;
  uint32_t max_level;
  uint32_t abcd [4];
  uint local_40;
  uint local_3c;
  uint32_t flags;
  TargetBits supported;
  memory_order __b;
  memory_order __b_1;
  
  std::operator&(memory_order_acquire,__memory_order_mask);
  if ((anonymous_namespace)::supported_ == 0) {
    Cpuid(0,0,&stack0xffffffffffffffa8);
    Cpuid(1,0,&stack0xffffffffffffffa8);
    bVar1 = anon_unknown_0::IsBitSet(abcd[1],0x19);
    bVar2 = anon_unknown_0::IsBitSet(abcd[1],0x1a);
    uVar5 = 0;
    if (bVar2) {
      uVar5 = 2;
    }
    bVar2 = anon_unknown_0::IsBitSet(abcd[0],0);
    uVar6 = 0;
    if (bVar2) {
      uVar6 = 4;
    }
    bVar2 = anon_unknown_0::IsBitSet(abcd[0],9);
    uVar7 = 0;
    if (bVar2) {
      uVar7 = 8;
    }
    bVar2 = anon_unknown_0::IsBitSet(abcd[0],0x13);
    uVar8 = 0;
    if (bVar2) {
      uVar8 = 0x10;
    }
    anon_unknown_0::IsBitSet(abcd[0],0x14);
    bVar2 = anon_unknown_0::IsBitSet(abcd[0],0xc);
    uVar9 = 0;
    if (bVar2) {
      uVar9 = 0x100;
    }
    bVar2 = anon_unknown_0::IsBitSet(abcd[0],0x1c);
    uVar10 = 0;
    if (bVar2) {
      uVar10 = 0x40;
    }
    bVar2 = anon_unknown_0::IsBitSet(abcd[0],0x1a);
    bVar3 = anon_unknown_0::IsBitSet(abcd[0],0x1b);
    Cpuid(0x80000001,0,&stack0xffffffffffffffa8);
    bVar4 = anon_unknown_0::IsBitSet(abcd[0],5);
    local_40 = 0;
    if (bVar4) {
      local_40 = 0x200;
    }
    local_40 = local_40 | uVar10 | uVar9 | uVar8 | uVar7 | uVar6 | uVar5 | bVar1;
    if (6 < uStack_58) {
      Cpuid(7,0,&stack0xffffffffffffffa8);
      bVar1 = anon_unknown_0::IsBitSet(max_level,3);
      uVar5 = 0;
      if (bVar1) {
        uVar5 = 0x400;
      }
      bVar1 = anon_unknown_0::IsBitSet(max_level,5);
      uVar6 = 0;
      if (bVar1) {
        uVar6 = 0x80;
      }
      bVar1 = anon_unknown_0::IsBitSet(max_level,8);
      uVar7 = 0;
      if (bVar1) {
        uVar7 = 0x800;
      }
      local_40 = uVar7 | uVar6 | uVar5 | local_40;
    }
    if ((bVar2) && (bVar3)) {
      uVar11 = anon_unknown_0::ReadXCR0();
      if (((uVar11 & 2) == 0) || ((uVar11 & 4) == 0)) {
        local_40 = local_40 & 0xffffff3f;
      }
    }
    else {
      local_40 = local_40 & 0xffffff3f;
    }
    local_3c = 1;
    if ((local_40 & 0xfc0) == 0xfc0) {
      local_3c = 5;
    }
    if ((local_40 & 0x1f) == 0x1f) {
      local_3c = local_3c | 2;
    }
    std::operator&(memory_order_release,__memory_order_mask);
    (anonymous_namespace)::supported_ = local_3c;
  }
  return (anonymous_namespace)::supported_;
}

Assistant:

TargetBits InstructionSets::Supported() {
  TargetBits supported = supported_.load(std::memory_order_acquire);
  // Already initialized, return that.
  if (HH_LIKELY(supported)) {
    return supported;
  }

  uint32_t flags = 0;
  uint32_t abcd[4];

  Cpuid(0, 0, abcd);
  const uint32_t max_level = abcd[0];

  // Standard feature flags
  Cpuid(1, 0, abcd);
  flags |= IsBitSet(abcd[3], 25) ? kBitSSE : 0;
  flags |= IsBitSet(abcd[3], 26) ? kBitSSE2 : 0;
  flags |= IsBitSet(abcd[2], 0) ? kBitSSE3 : 0;
  flags |= IsBitSet(abcd[2], 9) ? kBitSSSE3 : 0;
  flags |= IsBitSet(abcd[2], 19) ? kBitSSE41 : 0;
  flags |= IsBitSet(abcd[2], 20) ? kBitSSE42 : 0;
  flags |= IsBitSet(abcd[2], 12) ? kBitFMA : 0;
  flags |= IsBitSet(abcd[2], 28) ? kBitAVX : 0;
  const bool has_xsave = IsBitSet(abcd[2], 26);
  const bool has_osxsave = IsBitSet(abcd[2], 27);

  // Extended feature flags
  Cpuid(0x80000001U, 0, abcd);
  flags |= IsBitSet(abcd[2], 5) ? kBitLZCNT : 0;

  // Extended features
  if (max_level >= 7) {
    Cpuid(7, 0, abcd);
    flags |= IsBitSet(abcd[1], 3) ? kBitBMI : 0;
    flags |= IsBitSet(abcd[1], 5) ? kBitAVX2 : 0;
    flags |= IsBitSet(abcd[1], 8) ? kBitBMI2 : 0;
  }

  // Verify OS support for XSAVE, without which XMM/YMM registers are not
  // preserved across context switches and are not safe to use.
  if (has_xsave && has_osxsave) {
    const uint32_t xcr0 = ReadXCR0();
    // XMM/YMM
    if ((xcr0 & 2) == 0 || (xcr0 & 4) == 0) {
      flags &= ~(kBitAVX | kBitAVX2);
    }
  } else {
    // Clear the AVX/AVX2 bits if the CPU or OS does not support XSAVE.
    //
    // The lower 128 bits of XMM0-XMM15 are guaranteed to be preserved across
    // context switches on x86_64 and any modern 32-bit system, so only AVX2
    // needs to be disabled.
    flags &= ~(kBitAVX | kBitAVX2);
  }

  // Also indicates "supported" has been initialized.
  supported = HH_TARGET_Portable;

  // Set target bit(s) if all their group's flags are all set.
  if ((flags & kGroupAVX2) == kGroupAVX2) {
    supported |= HH_TARGET_AVX2;
  }
  if ((flags & kGroupSSE41) == kGroupSSE41) {
    supported |= HH_TARGET_SSE41;
  }

  supported_.store(supported, std::memory_order_release);
  return supported;
}